

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instruction.cpp
# Opt level: O1

bool __thiscall
ICM::Compiler::InstructionCreater::createNodeIf(InstructionCreater *this,Node *node,Element *refelt)

{
  pointer *pppIVar1;
  Element *element;
  pointer pEVar2;
  undefined8 uVar3;
  iterator __position;
  InstructionData *instdata;
  uint_t uVar4;
  ulong uVar5;
  Jump **ppJVar6;
  vector<ICM::Instruction::Insts::Jump_*,_std::allocator<ICM::Instruction::Insts::Jump_*>_>
  *__range2;
  long lVar7;
  long lVar8;
  vector<ICM::Instruction::Insts::Jump_*,_std::allocator<ICM::Instruction::Insts::Jump_*>_> recordJ;
  Jump *jinst;
  Jump **local_78;
  iterator iStack_70;
  Jump **local_68;
  Node *local_60;
  vector<ICM::Instruction::InstructionData*,std::allocator<ICM::Instruction::InstructionData*>>
  *local_58;
  Jump *local_50;
  Element *local_48;
  long local_40;
  Jump *local_38;
  
  uVar5 = (ulong)((long)(node->
                        super_vector<ICM::ASTBase::Element,_std::allocator<ICM::ASTBase::Element>_>)
                        .
                        super__Vector_base<ICM::ASTBase::Element,_std::allocator<ICM::ASTBase::Element>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                  (long)(node->
                        super_vector<ICM::ASTBase::Element,_std::allocator<ICM::ASTBase::Element>_>)
                        .
                        super__Vector_base<ICM::ASTBase::Element,_std::allocator<ICM::ASTBase::Element>_>
                        ._M_impl.super__Vector_impl_data._M_start >> 4) >> 1;
  local_78 = (Jump **)0x0;
  iStack_70._M_current = (Jump **)0x0;
  local_68 = (Jump **)0x0;
  local_60 = node;
  local_48 = refelt;
  if (uVar5 != 1) {
    local_58 = (vector<ICM::Instruction::InstructionData*,std::allocator<ICM::Instruction::InstructionData*>>
                *)&this->InstList;
    lVar8 = uVar5 - 1;
    local_40 = uVar5 << 4;
    lVar7 = 0x10;
    do {
      pEVar2 = (local_60->
               super_vector<ICM::ASTBase::Element,_std::allocator<ICM::ASTBase::Element>_>).
               super__Vector_base<ICM::ASTBase::Element,_std::allocator<ICM::ASTBase::Element>_>.
               _M_impl.super__Vector_impl_data._M_start;
      element = (Element *)((long)&pEVar2->field_0 + lVar7);
      createReferNode(this,element);
      instdata = (InstructionData *)operator_new(0x28);
      instdata->_vptr_InstructionData = (_func_int **)0x0;
      *(undefined8 *)&instdata->Inst = 0;
      instdata[1]._vptr_InstructionData = (_func_int **)0x0;
      *(undefined8 *)&instdata[1].Inst = 0;
      instdata[2]._vptr_InstructionData = (_func_int **)0x0;
      instdata->Inst = jmpn;
      instdata->_vptr_InstructionData = (_func_int **)&PTR_getToString_abi_cxx11__00151e48;
      *(undefined4 *)&instdata[1]._vptr_InstructionData = 0;
      *(undefined8 *)&instdata[1].Inst = 0;
      uVar3 = *(undefined8 *)((long)&pEVar2->index + lVar7);
      *(undefined4 *)&instdata[1]._vptr_InstructionData =
           *(undefined4 *)((long)&pEVar2->field_0 + lVar7);
      *(undefined8 *)&instdata[1].Inst = uVar3;
      Instruction::InstructionList::push((InstructionList *)local_58,instdata);
      createReferNode(this,(Element *)((long)&element[-1].field_0 + local_40));
      local_50 = (Jump *)operator_new(0x18);
      (local_50->super_InstDataBase<(ICM::Instruction::Instruction)30>).super_InstructionData.
      _vptr_InstructionData = (_func_int **)0x0;
      *(undefined8 *)
       &(local_50->super_InstDataBase<(ICM::Instruction::Instruction)30>).super_InstructionData.Inst
           = 0;
      local_50->Index = 0;
      (local_50->super_InstDataBase<(ICM::Instruction::Instruction)30>).super_InstructionData.Inst =
           jump;
      (local_50->super_InstDataBase<(ICM::Instruction::Instruction)30>).super_InstructionData.
      _vptr_InstructionData = (_func_int **)&PTR_getToString_abi_cxx11__00151e00;
      if (iStack_70._M_current == local_68) {
        std::vector<ICM::Instruction::Insts::Jump*,std::allocator<ICM::Instruction::Insts::Jump*>>::
        _M_realloc_insert<ICM::Instruction::Insts::Jump*const&>
                  ((vector<ICM::Instruction::Insts::Jump*,std::allocator<ICM::Instruction::Insts::Jump*>>
                    *)&local_78,iStack_70,&local_50);
      }
      else {
        *iStack_70._M_current = local_50;
        iStack_70._M_current = iStack_70._M_current + 1;
      }
      local_38 = local_50;
      __position._M_current =
           (this->InstList).
           super_vector<ICM::Instruction::InstructionData_*,_std::allocator<ICM::Instruction::InstructionData_*>_>
           .
           super__Vector_base<ICM::Instruction::InstructionData_*,_std::allocator<ICM::Instruction::InstructionData_*>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      if (__position._M_current ==
          (this->InstList).
          super_vector<ICM::Instruction::InstructionData_*,_std::allocator<ICM::Instruction::InstructionData_*>_>
          .
          super__Vector_base<ICM::Instruction::InstructionData_*,_std::allocator<ICM::Instruction::InstructionData_*>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::
        vector<ICM::Instruction::InstructionData*,std::allocator<ICM::Instruction::InstructionData*>>
        ::_M_realloc_insert<ICM::Instruction::InstructionData*>
                  (local_58,__position,(InstructionData **)&local_38);
      }
      else {
        *__position._M_current = (InstructionData *)local_50;
        pppIVar1 = &(this->InstList).
                    super_vector<ICM::Instruction::InstructionData_*,_std::allocator<ICM::Instruction::InstructionData_*>_>
                    .
                    super__Vector_base<ICM::Instruction::InstructionData_*,_std::allocator<ICM::Instruction::InstructionData_*>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
        *pppIVar1 = *pppIVar1 + 1;
      }
      instdata[2]._vptr_InstructionData =
           (_func_int **)
           ((long)(this->InstList).
                  super_vector<ICM::Instruction::InstructionData_*,_std::allocator<ICM::Instruction::InstructionData_*>_>
                  .
                  super__Vector_base<ICM::Instruction::InstructionData_*,_std::allocator<ICM::Instruction::InstructionData_*>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
            (long)(this->InstList).
                  super_vector<ICM::Instruction::InstructionData_*,_std::allocator<ICM::Instruction::InstructionData_*>_>
                  .
                  super__Vector_base<ICM::Instruction::InstructionData_*,_std::allocator<ICM::Instruction::InstructionData_*>_>
                  ._M_impl.super__Vector_impl_data._M_start >> 3);
      lVar7 = lVar7 + 0x10;
      lVar8 = lVar8 + -1;
    } while (lVar8 != 0);
  }
  createReferNode(this,(local_60->
                       super_vector<ICM::ASTBase::Element,_std::allocator<ICM::ASTBase::Element>_>).
                       super__Vector_base<ICM::ASTBase::Element,_std::allocator<ICM::ASTBase::Element>_>
                       ._M_impl.super__Vector_impl_data._M_finish + -1);
  Instruction::InstructionList::push(&this->InstList,sing);
  uVar4 = ((long)(this->InstList).
                 super_vector<ICM::Instruction::InstructionData_*,_std::allocator<ICM::Instruction::InstructionData_*>_>
                 .
                 super__Vector_base<ICM::Instruction::InstructionData_*,_std::allocator<ICM::Instruction::InstructionData_*>_>
                 ._M_impl.super__Vector_impl_data._M_finish -
           (long)(this->InstList).
                 super_vector<ICM::Instruction::InstructionData_*,_std::allocator<ICM::Instruction::InstructionData_*>_>
                 .
                 super__Vector_base<ICM::Instruction::InstructionData_*,_std::allocator<ICM::Instruction::InstructionData_*>_>
                 ._M_impl.super__Vector_impl_data._M_start >> 3) - 1;
  for (ppJVar6 = local_78; ppJVar6 != iStack_70._M_current; ppJVar6 = ppJVar6 + 1) {
    (*ppJVar6)->Index = uVar4;
  }
  if ((local_48->field_0).field_0.etype == '\x02') {
    local_48->index = uVar4;
    if (local_78 != (Jump **)0x0) {
      operator_delete(local_78,(long)local_68 - (long)local_78);
    }
    return true;
  }
  __assert_fail("isRefer()",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/Chill-Language[P]ICM/include/parser/ast.h"
                ,0x34,"void ICM::ASTBase::Element::setRefer(size_t)");
}

Assistant:

bool createNodeIf(Node &node, Element &refelt) {
				size_t count = node.size() / 2 - 1;
				vector<Insts::Jump*> recordJ;
				for (size_t i : range(1, 1 + count)) {
					Element &be = node[i];
					Element &de = node[i + count];

					createReferNode(be);
					auto *inst = new Insts::JumpNot();
					inst->Data = ConvertToInstElement(be);
					InstList.push(inst);
					createReferNode(de);
					auto *jinst = new Insts::Jump();
					recordJ.push_back(jinst);
					InstList.push_back(jinst);
					inst->Index = NextInstID();
				}
				createReferNode(node.back());
				InstList.push(sing);
				size_t index = CurrInstID();
				for (auto *p : recordJ) {
					p->Index = index;
				}
				refelt.setRefer(index);
				return true;
			}